

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall
tetgenmesh::insertconstrainedpoints(tetgenmesh *this,point *insertarray,int arylen,int rejflag)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  verttype vVar7;
  arraypool *paVar8;
  long bak_vol_count;
  long bak_fac_count;
  long bak_seg_count;
  long baksmaples;
  long bak_nonregularcount;
  int ngroup;
  int randindex;
  point swappoint;
  uint local_150;
  int i;
  int t1ver;
  int randflag;
  flipconstraints fc;
  insertvertexflags ivf;
  face splitseg;
  face splitsh;
  triface spintet;
  triface searchtet;
  int rejflag_local;
  int arylen_local;
  point *insertarray_local;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&spintet.ver);
  triface::triface((triface *)&splitsh.shver);
  face::face((face *)&splitseg.shver);
  face::face((face *)&ivf.parentpt);
  insertvertexflags::insertvertexflags((insertvertexflags *)&fc.remvert);
  flipconstraints::flipconstraints((flipconstraints *)&t1ver);
  i = 0;
  if (this->b->verbose != 0) {
    printf("  Inserting %d constrained points\n",(ulong)(uint)arylen);
  }
  if (this->b->no_sort == 0) {
    if (this->b->verbose != 0) {
      printf("  Permuting vertices.\n");
    }
    srand(arylen);
    for (swappoint._4_4_ = 0; swappoint._4_4_ < arylen; swappoint._4_4_ = swappoint._4_4_ + 1) {
      iVar6 = rand();
      bak_nonregularcount._4_4_ = iVar6 % (swappoint._4_4_ + 1);
      _ngroup = insertarray[swappoint._4_4_];
      insertarray[swappoint._4_4_] = insertarray[bak_nonregularcount._4_4_];
      insertarray[bak_nonregularcount._4_4_] = _ngroup;
    }
    if (this->b->brio_hilbert == 0) {
      i = 1;
    }
    else {
      if (this->b->verbose != 0) {
        printf("  Sorting vertices.\n");
      }
      hilbert_init(this,this->in->mesh_dim);
      bak_nonregularcount._0_4_ = 0;
      brio_multiscale_sort
                (this,insertarray,arylen,this->b->brio_threshold,this->b->brio_ratio,
                 (int *)&bak_nonregularcount);
    }
  }
  else if (this->b->verbose != 0) {
    printf("  Using the input order.\n");
  }
  lVar1 = this->nonregularcount;
  this->nonregularcount = 0;
  lVar2 = this->samples;
  this->samples = 3;
  lVar3 = this->st_segref_count;
  lVar4 = this->st_facref_count;
  lVar5 = this->st_volref_count;
  fc.remvert._4_1_ = this->b->incrflip == 0;
  if (!fc.remvert._4_1_) {
    t1ver = 2;
  }
  ivf.lawson = (int)fc.remvert._4_1_;
  ivf.iloc = (int)!fc.remvert._4_1_;
  fc.remvert._5_3_ = 0;
  ivf.respectbdflag = 0;
  ivf.cdtflag = 0xb;
  ivf.assignmeshsize = 3;
  ivf.bowywat = 1;
  ivf.splitbdflag = 1;
  ivf.chkencflag = this->b->metric;
  ivf.validflag = rejflag;
  paVar8 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(paVar8,0x10,8);
  this->encseglist = paVar8;
  paVar8 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(paVar8,0x88,8);
  this->encshlist = paVar8;
  swappoint._4_4_ = 0;
  do {
    if (arylen <= swappoint._4_4_) {
      paVar8 = this->encseglist;
      if (paVar8 != (arraypool *)0x0) {
        arraypool::~arraypool(paVar8);
        operator_delete(paVar8,0x30);
      }
      paVar8 = this->encshlist;
      if (paVar8 != (arraypool *)0x0) {
        arraypool::~arraypool(paVar8);
        operator_delete(paVar8,0x30);
      }
      if ((this->b->verbose != 0) &&
         (printf("  Inserted %ld (%ld, %ld, %ld) vertices.\n",
                 (this->st_segref_count + this->st_facref_count + this->st_volref_count) -
                 (lVar3 + lVar4 + lVar5),this->st_segref_count - lVar3,this->st_facref_count - lVar4
                 ,this->st_volref_count - lVar5), 0 < this->nonregularcount)) {
        printf("  Performed %ld brute-force searches.\n",this->nonregularcount);
      }
      this->nonregularcount = lVar1;
      this->samples = lVar2;
      return;
    }
    spintet.ver = 0;
    spintet._12_4_ = 0;
    fc.remvert._0_4_ = scoutpoint(this,insertarray[swappoint._4_4_],(triface *)&spintet.ver,i);
    setpointtype(this,insertarray[swappoint._4_4_],FREEVOLVERTEX);
    splitseg.shver = 0;
    splitseg._12_4_ = 0;
    ivf.parentpt = (point)0x0;
    if ((int)fc.remvert == 4) {
      if ((*(long *)(spintet._8_8_ + 0x40) == 0) ||
         (*(long *)(*(long *)(spintet._8_8_ + 0x40) + (long)ver2edge[(int)(uint)searchtet.tet] * 8)
          == 0)) {
        triface::operator=((triface *)&splitsh.shver,(triface *)&spintet.ver);
        do {
          if ((*(long *)(splitsh._8_8_ + 0x48) != 0) &&
             (*(long *)(*(long *)(splitsh._8_8_ + 0x48) + (long)(int)((uint)spintet.tet & 3) * 8) !=
              0)) {
            tspivot(this,(triface *)&splitsh.shver,(face *)&splitseg.shver);
            setpointtype(this,insertarray[swappoint._4_4_],FREEFACETVERTEX);
            break;
          }
          local_150 = (uint)spintet.tet;
          decode(this,*(tetrahedron *)(splitsh._8_8_ + (long)facepivot1[(int)(uint)spintet.tet] * 8)
                 ,(triface *)&splitsh.shver);
          spintet.tet._0_4_ = facepivot2[(int)local_150][(int)(uint)spintet.tet];
        } while (splitsh._8_8_ != spintet._8_8_);
      }
      else {
        tsspivot1(this,(triface *)&spintet.ver,(face *)&ivf.parentpt);
        setpointtype(this,insertarray[swappoint._4_4_],FREESEGVERTEX);
      }
    }
    else if ((((int)fc.remvert == 3) && (*(long *)(spintet._8_8_ + 0x48) != 0)) &&
            (*(long *)(*(long *)(spintet._8_8_ + 0x48) + (long)(int)((uint)searchtet.tet & 3) * 8)
             != 0)) {
      tspivot(this,(triface *)&spintet.ver,(face *)&splitseg.shver);
      setpointtype(this,insertarray[swappoint._4_4_],FREEFACETVERTEX);
    }
    iVar6 = insertpoint(this,insertarray[swappoint._4_4_],(triface *)&spintet.ver,
                        (face *)&splitseg.shver,(face *)&ivf.parentpt,
                        (insertvertexflags *)&fc.remvert);
    if (iVar6 == 0) {
      setpointtype(this,insertarray[swappoint._4_4_],UNUSEDVERTEX);
      this->unuverts = this->unuverts + 1;
      arraypool::restart(this->encseglist);
      arraypool::restart(this->encshlist);
    }
    else {
      if (this->flipstack != (badface *)0x0) {
        lawsonflip3d(this,(flipconstraints *)&t1ver);
        arraypool::restart(this->unflipqueue);
      }
      vVar7 = pointtype(this,insertarray[swappoint._4_4_]);
      if (vVar7 == FREESEGVERTEX) {
        this->st_segref_count = this->st_segref_count + 1;
      }
      else {
        vVar7 = pointtype(this,insertarray[swappoint._4_4_]);
        if (vVar7 == FREEFACETVERTEX) {
          this->st_facref_count = this->st_facref_count + 1;
        }
        else {
          this->st_volref_count = this->st_volref_count + 1;
        }
      }
    }
    swappoint._4_4_ = swappoint._4_4_ + 1;
  } while( true );
}

Assistant:

void tetgenmesh::insertconstrainedpoints(point *insertarray, int arylen,
                                         int rejflag)
{
  triface searchtet, spintet;
  face splitsh;
  face splitseg;
  insertvertexflags ivf;
  flipconstraints fc;
  int randflag = 0;
  int t1ver;
  int i;

  if (b->verbose) {
    printf("  Inserting %d constrained points\n", arylen);
  }

  if (b->no_sort) { // -b/1 option.
    if (b->verbose) {
      printf("  Using the input order.\n"); 
    }
  } else {
    if (b->verbose) {
      printf("  Permuting vertices.\n"); 
    }
    point swappoint;
    int randindex;
    srand(arylen);
    for (i = 0; i < arylen; i++) {
      randindex = rand() % (i + 1); 
      swappoint = insertarray[i];
      insertarray[i] = insertarray[randindex];
      insertarray[randindex] = swappoint;
    }
    if (b->brio_hilbert) { // -b1 option
      if (b->verbose) {
        printf("  Sorting vertices.\n"); 
      }
      hilbert_init(in->mesh_dim);
      int ngroup = 0; 
      brio_multiscale_sort(insertarray, arylen, b->brio_threshold, 
                           b->brio_ratio, &ngroup);
    } else { // -b0 option.
      randflag = 1;
    } // if (!b->brio_hilbert)
  } // if (!b->no_sort)

  long bak_nonregularcount = nonregularcount;
  nonregularcount = 0l;
  long baksmaples = samples;
  samples = 3l; // Use at least 3 samples. Updated in randomsample().

  long bak_seg_count = st_segref_count;
  long bak_fac_count = st_facref_count;
  long bak_vol_count = st_volref_count;

  // Initialize the insertion parameters. 
  if (b->incrflip) { // -l option
    // Use incremental flip algorithm.
    ivf.bowywat = 0; 
    ivf.lawson = 1;
    ivf.validflag = 0; // No need to validate the cavity.
    fc.enqflag = 2;
  } else {
    // Use Bowyer-Watson algorithm.
    ivf.bowywat = 1; 
    ivf.lawson = 0;
    ivf.validflag = 1; // Validate the B-W cavity.
  }
  ivf.rejflag = rejflag;
  ivf.chkencflag = 0; 
  ivf.sloc = (int) INSTAR;
  ivf.sbowywat = 3; 
  ivf.splitbdflag = 1;
  ivf.respectbdflag = 1;
  ivf.assignmeshsize = b->metric;

  encseglist = new arraypool(sizeof(face), 8);
  encshlist = new arraypool(sizeof(badface), 8);

  // Insert the points.
  for (i = 0; i < arylen; i++) {
    // Find the location of the inserted point.
    // Do not use 'recenttet', since the mesh may be non-convex.
    searchtet.tet = NULL; 
    ivf.iloc = scoutpoint(insertarray[i], &searchtet, randflag);

    // Decide the right type for this point.
    setpointtype(insertarray[i], FREEVOLVERTEX); // Default.
    splitsh.sh = NULL;
    splitseg.sh = NULL;
    if (ivf.iloc == (int) ONEDGE) {
      if (issubseg(searchtet)) {
        tsspivot1(searchtet, splitseg);
        setpointtype(insertarray[i], FREESEGVERTEX);
        //ivf.rejflag = 0;
      } else {
        // Check if it is a subface edge.
        spintet = searchtet;
        while (1) {
          if (issubface(spintet)) {
            tspivot(spintet, splitsh);
            setpointtype(insertarray[i], FREEFACETVERTEX);
            //ivf.rejflag |= 1;
            break;
          }
          fnextself(spintet);
          if (spintet.tet == searchtet.tet) break;
        }
      }
    } else if (ivf.iloc == (int) ONFACE) {
      if (issubface(searchtet)) {
        tspivot(searchtet, splitsh);
        setpointtype(insertarray[i], FREEFACETVERTEX);
        //ivf.rejflag |= 1;
      }
    }

    // Now insert the point.
    if (insertpoint(insertarray[i], &searchtet, &splitsh, &splitseg, &ivf)) {
      if (flipstack != NULL) {
        // There are queued faces. Use flips to recover Delaunayness.
        lawsonflip3d(&fc);
        // There may be unflippable edges. Ignore them.
        unflipqueue->restart();
      }
      // Update the Steiner counters.
      if (pointtype(insertarray[i]) == FREESEGVERTEX) {
        st_segref_count++;
      } else if (pointtype(insertarray[i]) == FREEFACETVERTEX) {
        st_facref_count++;
      } else {
        st_volref_count++;
      }
    } else {
      // Point is not inserted.
      //pointdealloc(insertarray[i]);
      setpointtype(insertarray[i], UNUSEDVERTEX);
      unuverts++;
      encseglist->restart();
      encshlist->restart();
    }
  } // i

  delete encseglist;
  delete encshlist;

  if (b->verbose) {
    printf("  Inserted %ld (%ld, %ld, %ld) vertices.\n", 
           st_segref_count + st_facref_count + st_volref_count - 
           (bak_seg_count + bak_fac_count + bak_vol_count),
           st_segref_count - bak_seg_count, st_facref_count - bak_fac_count,
           st_volref_count - bak_vol_count);
    if (nonregularcount > 0l) {
      printf("  Performed %ld brute-force searches.\n", nonregularcount);
    }
  }

  nonregularcount = bak_nonregularcount;
  samples = baksmaples; 
}